

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O2

void __thiscall autoSimplification_power2_Test::TestBody(autoSimplification_power2_Test *this)

{
  ExprPtr *ex;
  char *message;
  double dVar1;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  string local_68;
  ExprPtr e;
  ExprPtr x;
  ExprPtr f1o3;
  ExprPtr f1o2;
  
  mathiu::impl::fraction((Integer)&f1o2,1);
  mathiu::impl::fraction((Integer)&f1o3,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"x",(allocator<char> *)&e);
  mathiu::impl::symbol((string *)&x);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_68);
  dVar1 = mathiu::impl::pow((impl *)&local_68,dVar1,in_XMM1_Qa);
  mathiu::impl::pow((impl *)&gtest_ar,dVar1,in_XMM1_Qa);
  mathiu::impl::operator*((impl *)&e,(ExprPtr *)&local_68,(ExprPtr *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  mathiu::impl::toString_abi_cxx11_(&local_68,(impl *)&e,ex);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&gtest_ar,"toString(e)","\"(^ x 5/6)\"",&local_68,
             (char (*) [10])"(^ x 5/6)");
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x18e,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1o3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1o2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(autoSimplification, power2)
{
    auto const f1o2 = fraction(1, 2);
    auto const f1o3 = fraction(1, 3);
    auto const x = symbol("x");
    auto const e = (x ^ f1o2) * (x ^ f1o3);
    EXPECT_EQ(toString(e), "(^ x 5/6)");
}